

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::unregister(CommonCore *this)

{
  char *pcVar1;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  shared_ptr<helics::Core> keepCoreAlive2;
  shared_ptr<helics::Core> keepCoreAlive;
  CommonCore *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  CommonCore *in_stack_ffffffffffffffe0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffe8;
  
  name_01._M_str = (char *)(this->super_BrokerBase).identifier._M_string_length;
  name_01._M_len = (size_t)&stack0xffffffffffffffe0;
  CoreFactory::findCore(name_01);
  if (in_stack_ffffffffffffffe0 == this) {
    name._M_str = (char *)in_stack_ffffffffffffffe8;
    name._M_len = (size_t)in_stack_ffffffffffffffe0;
    CoreFactory::unregisterCore(name);
  }
  pcVar1 = (char *)(this->prevIdentifier)._M_string_length;
  if (pcVar1 != (char *)0x0) {
    name_02._M_str = pcVar1;
    name_02._M_len = (size_t)&local_30;
    CoreFactory::findCore(name_02);
    if (local_30 == this) {
      name_00._M_str = (char *)in_stack_ffffffffffffffe8;
      name_00._M_len = (size_t)in_stack_ffffffffffffffe0;
      CoreFactory::unregisterCore(name_00);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
  }
  if (in_stack_ffffffffffffffe8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void CommonCore::unregister()
{
    /*We need to ensure that the destructor is not called immediately upon calling unregister
    otherwise this would be a mess and probably cause segmentation faults so we capture it in a
    local variable that will be destroyed on function exit
    */
    auto keepCoreAlive = CoreFactory::findCore(identifier);
    if (keepCoreAlive) {
        if (keepCoreAlive.get() == this) {
            CoreFactory::unregisterCore(identifier);
        }
    }

    if (!prevIdentifier.empty()) {
        auto keepCoreAlive2 = CoreFactory::findCore(prevIdentifier);
        if (keepCoreAlive2) {
            if (keepCoreAlive2.get() == this) {
                CoreFactory::unregisterCore(prevIdentifier);
            }
        }
    }
}